

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

ImVec2 __thiscall BoardView::CoordToScreen(BoardView *this,float x,float y,float w)

{
  int iVar1;
  long in_RDI;
  float in_XMM0_Da;
  float _x;
  float _y;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float ty;
  float tx;
  float side;
  ImVec2 local_8;
  
  _x = *(float *)(&DAT_002a76a0 + (ulong)(*(int *)(in_RDI + 0xd5dc) != 0) * 4) *
       *(float *)(in_RDI + 0xd5c8) *
       (in_XMM2_Da * (*(float *)(in_RDI + 0xd5b8) - *(float *)(in_RDI + 0xd5c0)) + in_XMM0_Da);
  _y = -*(float *)(in_RDI + 0xd5c8) *
       (in_XMM2_Da * (*(float *)(in_RDI + 0xd5bc) - *(float *)(in_RDI + 0xd5c4)) + in_XMM1_Da);
  iVar1 = *(int *)(in_RDI + 0xd5d8);
  if (iVar1 == 0) {
    ImVec2::ImVec2(&local_8,_x,_y);
  }
  else if (iVar1 == 1) {
    ImVec2::ImVec2(&local_8,-_y,_x);
  }
  else if (iVar1 == 2) {
    ImVec2::ImVec2(&local_8,-_x,-_y);
  }
  else {
    ImVec2::ImVec2(&local_8,_y,-_x);
  }
  return local_8;
}

Assistant:

ImVec2 BoardView::CoordToScreen(float x, float y, float w) {
	float side = m_current_side ? -1.0f : 1.0f;
	float tx   = side * m_scale * (x + w * (m_dx - m_mx));
	float ty   = -1.0f * m_scale * (y + w * (m_dy - m_my));
	switch (m_rotation) {
		case 0: return ImVec2(tx, ty);
		case 1: return ImVec2(-ty, tx);
		case 2: return ImVec2(-tx, -ty);
		default: return ImVec2(ty, -tx);
	}
}